

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clhash.c
# Opt level: O2

__m128i mul128by128to128_lazymod127(__m128i A,__m128i B)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  longlong in_RAX;
  ulong in_XMM0_Qa;
  ulong in_XMM0_Qb;
  ulong in_XMM1_Qa;
  ulong in_XMM1_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i alVar11;
  
  auVar10._8_8_ = 0;
  auVar10._0_8_ = in_XMM0_Qb;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_XMM1_Qa;
  auVar8 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar10 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar8 = auVar8 ^ auVar9 << uVar1;
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = in_XMM1_Qb;
  auVar10 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar10 = auVar10 ^ auVar7 << uVar1;
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_XMM1_Qa;
  auVar9 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar9 = auVar9 ^ auVar3 << uVar1;
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_XMM0_Qb;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_XMM1_Qb;
  auVar4 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ auVar6 << uVar1;
    }
  }
  auVar7 = vpslldq_avx(auVar10 ^ auVar8,8);
  auVar8 = vpsrldq_avx(auVar10 ^ auVar8,8);
  auVar4 = auVar4 ^ auVar8;
  auVar10 = vpsrlq_avx(auVar4,0x3f);
  auVar8 = vpaddq_avx(auVar4,auVar4);
  auVar10 = vpslldq_avx(auVar10,8);
  auVar8 = vpternlogq_avx512vl(auVar10,auVar9 ^ auVar7,auVar8,0x36);
  auVar9 = vpsllq_avx(auVar4,2);
  auVar10 = vpsrlq_avx(auVar4,0x3e);
  auVar10 = vpslldq_avx(auVar10,8);
  vpternlogq_avx512vl(auVar10,auVar8,auVar9,0x36);
  alVar11[1] = B[0];
  alVar11[0] = in_RAX;
  return alVar11;
}

Assistant:

static inline  __m128i mul128by128to128_lazymod127( __m128i A, __m128i B) {
    __m128i Amix1 = _mm_clmulepi64_si128(A,B,0x01);
    __m128i Amix2 = _mm_clmulepi64_si128(A,B,0x10);
    __m128i Alow = _mm_clmulepi64_si128(A,B,0x00);
    __m128i Ahigh = _mm_clmulepi64_si128(A,B,0x11);
    __m128i Amix = _mm_xor_si128(Amix1,Amix2);
    Amix1 = _mm_slli_si128(Amix,8);
    Amix2 = _mm_srli_si128(Amix,8);
    Alow = _mm_xor_si128(Alow,Amix1);
    Ahigh = _mm_xor_si128(Ahigh,Amix2);
    return lazymod127(Alow, Ahigh);
}